

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O2

MPP_RET h264e_vepu_prep_setup(HalH264eVepuPrep *prep,MppEncPrepCfg *cfg)

{
  undefined8 uVar1;
  MppFrameFormat format;
  int iVar2;
  MPP_RET MVar3;
  MppFrameFormat MVar4;
  int iVar5;
  MppEncRotationCfg MVar6;
  RK_U32 RVar7;
  undefined8 uVar8;
  VepuFormatCfg fmt_cfg;
  undefined4 local_38;
  undefined4 uStack_34;
  
  format = cfg->format;
  uVar1._0_4_ = cfg->width;
  uVar1._4_4_ = cfg->height;
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter\n","h264e_vepu_prep_setup");
  }
  if (cfg->mirroring != 0) {
    _mpp_log_l(2,"hal_h264e_vepu_v2","Warning: do not support mirroring\n","h264e_vepu_prep_setup");
  }
  MVar6 = cfg->rotation;
  uVar8 = uVar1;
  if (MVar6 != MPP_ENC_ROT_0) {
    uVar8 = CONCAT44((undefined4)uVar1,uVar1._4_4_);
    if (MVar6 != MPP_ENC_ROT_90) {
      if (MVar6 == MPP_ENC_ROT_270) {
        MVar6 = MPP_ENC_ROT_180;
      }
      else {
        MVar6 = MPP_ENC_ROT_0;
        _mpp_log_l(2,"hal_h264e_vepu_v2",
                   "Warning: only support 90 or 270 degree rotate, request rotate %d",
                   "h264e_vepu_prep_setup",0);
        uVar8 = uVar1;
      }
    }
  }
  prep->src_fmt = format;
  prep->rotation = MVar6;
  prep->src_w = (int)uVar8;
  prep->src_h = (int)((ulong)uVar8 >> 0x20);
  MVar3 = get_vepu_fmt(&fmt_cfg,format);
  if (MVar3 == MPP_OK) {
    prep->r_mask_msb = fmt_cfg.r_mask;
    prep->g_mask_msb = fmt_cfg.g_mask;
    prep->b_mask_msb = fmt_cfg.b_mask;
    prep->swap_8_in = fmt_cfg.swap_8_in;
    prep->swap_16_in = fmt_cfg.swap_16_in;
    prep->swap_32_in = fmt_cfg.swap_32_in;
    prep->src_fmt = fmt_cfg.format;
    MVar3 = MPP_OK;
    if (0xffff < format) {
      if (fmt_cfg.format == VEPU_FMT_BUTT) goto LAB_00226ba6;
      goto LAB_00226bc7;
    }
    if (fmt_cfg.format == VEPU_FMT_BUTT) goto LAB_00226b71;
LAB_00226b92:
    prep->color_conversion_coeff_a = 0;
    prep->color_conversion_coeff_b = 0;
    prep->color_conversion_coeff_c = 0;
    prep->color_conversion_coeff_e = 0;
    prep->color_conversion_coeff_f = 0;
  }
  else {
    prep->src_fmt = 9;
    if (format < MPP_FMT_RGB565) {
LAB_00226b71:
      _mpp_log_l(2,"hal_h264e_vepu_v2","vepu do not support input frame format %d\n",(char *)0x0,
                 (ulong)format);
      MVar3 = MPP_NOK;
      goto LAB_00226b92;
    }
LAB_00226ba6:
    MVar3 = MPP_NOK;
    _mpp_log_l(2,"hal_h264e_vepu_v2","vepu do not support input frame format %d\n",(char *)0x0,
               (ulong)format);
LAB_00226bc7:
    if (cfg->color == MPP_FRAME_SPC_BT709) {
      prep->color_conversion_coeff_a = 0x366d;
      prep->color_conversion_coeff_b = 0xb717;
      prep->color_conversion_coeff_c = 0x127c;
      prep->color_conversion_coeff_e = 0x89f5;
      prep->color_conversion_coeff_f = 0xa28f;
    }
    else {
      prep->color_conversion_coeff_a = 0x4c85;
      prep->color_conversion_coeff_b = 0x962b;
      prep->color_conversion_coeff_c = 0x1d50;
      prep->color_conversion_coeff_e = 0x9090;
      prep->color_conversion_coeff_f = 0xb694;
    }
  }
  RVar7 = cfg->hor_stride;
  iVar2 = cfg->ver_stride;
  prep->offset_cb = 0;
  prep->offset_cr = 0;
  get_vepu_pixel_stride(&prep->stride_cfg,prep->src_w,RVar7,format);
  RVar7 = (prep->stride_cfg).pixel_stride;
  prep->pixel_stride = RVar7;
  iVar5 = RVar7 * (prep->stride_cfg).pixel_size;
  MVar4 = format & 0xfffff;
  if (((MVar4 - MPP_FMT_RGB565 < 6) || (MVar4 - MPP_FMT_RGB101010 < 6)) ||
     (MVar4 == MPP_FMT_YUV422_UYVY)) {
LAB_00226c3e:
    prep->size_y = (long)iVar5 * ((long)prep->src_h + 0xfU & 0xfffffffffffffff0);
    prep->size_c = 0;
  }
  else {
    if (MVar4 == MPP_FMT_YUV420P) {
      RVar7 = iVar2 * iVar5;
      prep->offset_cb = RVar7;
      prep->offset_cr = (int)RVar7 / 4 + RVar7;
    }
    else {
      if (MVar4 == MPP_FMT_YUV422_YUYV) goto LAB_00226c3e;
      if (MVar4 != MPP_FMT_YUV420SP) {
        _mpp_log_l(2,"hal_h264e_vepu_v2","invalid format %d","h264e_vepu_prep_setup",(ulong)format);
        MVar3 = MPP_NOK;
        goto LAB_00226c5a;
      }
      prep->offset_cb = iVar2 * iVar5;
    }
    prep->size_y = (long)(int)((prep->src_h + 0xfU & 0xfffffff0) * iVar5);
    prep->size_c = (long)(int)((prep->src_h / 2 + 7U & 0xfffffff8) * (iVar5 / 2));
  }
LAB_00226c5a:
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave\n","h264e_vepu_prep_setup");
  }
  return MVar3;
}

Assistant:

MPP_RET h264e_vepu_prep_setup(HalH264eVepuPrep *prep, MppEncPrepCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    MppFrameFormat format = cfg->format;
    VepuFormatCfg fmt_cfg;
    RK_U32 width = cfg->width;
    RK_U32 height = cfg->height;
    RK_U32 rotation = 0;

    hal_h264e_dbg_buffer("enter\n");

    // do not support mirroring
    if (cfg->mirroring)
        mpp_err_f("Warning: do not support mirroring\n");

    if (cfg->rotation == MPP_ENC_ROT_90)
        rotation = 1;
    else if (cfg->rotation == MPP_ENC_ROT_270)
        rotation = 2;
    else if (cfg->rotation != MPP_ENC_ROT_0)
        mpp_err_f("Warning: only support 90 or 270 degree rotate, request rotate %d", rotation);

    if (rotation)
        MPP_SWAP(RK_U32, width, height);

    prep->src_fmt = format;
    prep->rotation = rotation;
    prep->src_w = width;
    prep->src_h = height;

    if (!get_vepu_fmt(&fmt_cfg, format)) {
        prep->r_mask_msb = fmt_cfg.r_mask;
        prep->g_mask_msb = fmt_cfg.g_mask;
        prep->b_mask_msb = fmt_cfg.b_mask;
        prep->swap_8_in  = fmt_cfg.swap_8_in;
        prep->swap_16_in = fmt_cfg.swap_16_in;
        prep->swap_32_in = fmt_cfg.swap_32_in;
        prep->src_fmt    = fmt_cfg.format;
    } else {
        prep->src_fmt = VEPU_FMT_BUTT;
    }

    if (format < MPP_FRAME_FMT_RGB) {
        // YUV case
        if (prep->src_fmt == VEPU_FMT_BUTT) {
            mpp_err("vepu do not support input frame format %d\n", format);
            ret = MPP_NOK;
        }

        prep->color_conversion_coeff_a = 0;
        prep->color_conversion_coeff_b = 0;
        prep->color_conversion_coeff_c = 0;
        prep->color_conversion_coeff_e = 0;
        prep->color_conversion_coeff_f = 0;
    } else {

        if (prep->src_fmt == VEPU_FMT_BUTT) {
            mpp_err("vepu do not support input frame format %d\n", format);
            ret = MPP_NOK;
        }

        switch (cfg->color) {
        case MPP_FRAME_SPC_RGB : {
            /* BT.601 */
            /* Y  = 0.2989 R + 0.5866 G + 0.1145 B
             * Cb = 0.5647 (B - Y) + 128
             * Cr = 0.7132 (R - Y) + 128
             */
            prep->color_conversion_coeff_a = 19589;
            prep->color_conversion_coeff_b = 38443;
            prep->color_conversion_coeff_c = 7504;
            prep->color_conversion_coeff_e = 37008;
            prep->color_conversion_coeff_f = 46740;
        } break;
        case MPP_FRAME_SPC_BT709 : {
            /* BT.709 */
            /* Y  = 0.2126 R + 0.7152 G + 0.0722 B
             * Cb = 0.5389 (B - Y) + 128
             * Cr = 0.6350 (R - Y) + 128
             */
            prep->color_conversion_coeff_a = 13933;
            prep->color_conversion_coeff_b = 46871;
            prep->color_conversion_coeff_c = 4732;
            prep->color_conversion_coeff_e = 35317;
            prep->color_conversion_coeff_f = 41615;
        } break;
        default : {
            prep->color_conversion_coeff_a = 19589;
            prep->color_conversion_coeff_b = 38443;
            prep->color_conversion_coeff_c = 7504;
            prep->color_conversion_coeff_e = 37008;
            prep->color_conversion_coeff_f = 46740;
        } break;
        }
    }

    /* NOTE: vepu only support 8bit encoding and stride must match with width align to 16 */
    RK_S32 hor_stride = cfg->hor_stride;
    RK_S32 ver_stride = cfg->ver_stride;
    VepuStrideCfg *stride_cfg = &prep->stride_cfg;

    prep->offset_cb = 0;
    prep->offset_cr = 0;
    get_vepu_pixel_stride(stride_cfg, prep->src_w, hor_stride, format);
    prep->pixel_stride = stride_cfg->pixel_stride;
    hor_stride = stride_cfg->pixel_stride * stride_cfg->pixel_size;

    switch (format & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP : {
        prep->offset_cb = hor_stride * ver_stride;
        prep->size_y = hor_stride * MPP_ALIGN(prep->src_h, 16);
        prep->size_c = hor_stride / 2 * MPP_ALIGN(prep->src_h / 2, 8);
    } break;
    case MPP_FMT_YUV420P : {
        prep->offset_cb = hor_stride * ver_stride;
        prep->offset_cr = prep->offset_cb + ((hor_stride * ver_stride) / 4);
        prep->size_y = hor_stride * MPP_ALIGN(prep->src_h, 16);
        prep->size_c = hor_stride / 2 * MPP_ALIGN(prep->src_h / 2, 8);
    } break;
    case MPP_FMT_YUV422_YUYV :
    case MPP_FMT_YUV422_UYVY : {
        prep->size_y = hor_stride * MPP_ALIGN(prep->src_h, 16);
        prep->size_c = 0;
    } break;
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_BGR444 : {
        prep->size_y = hor_stride * MPP_ALIGN(prep->src_h, 16);
        prep->size_c = 0;
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_RGBA8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 : {
        prep->size_y = hor_stride * MPP_ALIGN(prep->src_h, 16);
        prep->size_c = 0;
    } break;
    default: {
        mpp_err_f("invalid format %d", format);
        ret = MPP_NOK;
    }
    }

    hal_h264e_dbg_buffer("leave\n");

    return ret;
}